

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O0

void PrintUsage(char *argv0)

{
  char *argv0_local;
  
  fprintf(_stderr,"Usage: %s [arg] [arg] [arg] ...\n",argv0);
  fprintf(_stderr,"Where \'arg\' is one of:\n");
  fprintf(_stderr,"\t-delay <seconds>\n");
  fprintf(_stderr,"\t-width <pixels>\n");
  fprintf(_stderr,"\t-height <pixels>\n");
  fprintf(_stderr,"\t-bpp <bits>\n");
  fprintf(_stderr,"\t-format <fmt> (one of the: YV12, IYUV, YUY2, UYVY, YVYU)\n");
  fprintf(_stderr,"\t-hw\n");
  fprintf(_stderr,"\t-flip\n");
  fprintf(_stderr,"\t-scale (test scaling features, from 50%% upto window size)\n");
  fprintf(_stderr,"\t-mono (use monochromatic RGB2YUV conversion)\n");
  fprintf(_stderr,"\t-lum <perc> (use luminance correction during RGB2YUV conversion,\n");
  fprintf(_stderr,"\t             from 0%% to unlimited, normal is 100%%)\n");
  fprintf(_stderr,"\t-help (shows this help)\n");
  fprintf(_stderr,"\t-fullscreen (test overlay in fullscreen mode)\n");
  return;
}

Assistant:

static void PrintUsage(char *argv0)
{
	fprintf(stderr, "Usage: %s [arg] [arg] [arg] ...\n", argv0);
	fprintf(stderr, "Where 'arg' is one of:\n");
	fprintf(stderr, "	-delay <seconds>\n");
	fprintf(stderr, "	-width <pixels>\n");
	fprintf(stderr, "	-height <pixels>\n");
	fprintf(stderr, "	-bpp <bits>\n");
	fprintf(stderr, "	-format <fmt> (one of the: YV12, IYUV, YUY2, UYVY, YVYU)\n");
	fprintf(stderr, "	-hw\n");
	fprintf(stderr, "	-flip\n");
	fprintf(stderr, "	-scale (test scaling features, from 50%% upto window size)\n");
	fprintf(stderr, "	-mono (use monochromatic RGB2YUV conversion)\n");
	fprintf(stderr, "	-lum <perc> (use luminance correction during RGB2YUV conversion,\n");
	fprintf(stderr, "	             from 0%% to unlimited, normal is 100%%)\n");
	fprintf(stderr, "	-help (shows this help)\n");
	fprintf(stderr, "	-fullscreen (test overlay in fullscreen mode)\n");
}